

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O1

void print_log(char *func,int line_num,char *templ,__va_list_tag *va)

{
  char output [2048];
  char acStack_818 [2047];
  undefined1 local_19;
  
  snprintf(acStack_818,0x800,"%s:%d %s\n",func,(ulong)(uint)line_num,templ);
  local_19 = 0;
  vfprintf(_stderr,acStack_818,va);
  fflush(_stderr);
  return;
}

Assistant:

static void print_log(const char *func, int line_num, const char *templ, va_list va)
{
    char output[2048];

    /* create the output string template */
    snprintf(output, sizeof(output),"%s:%d %s\n", func, line_num, templ);

    /* make sure it is zero terminated */
    output[sizeof(output)-1] = 0;

    /* print it out. */
    vfprintf(stderr, output, va);

    fflush(stderr);
}